

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_145302::ArchiveShellCommand::getShortDescription
          (ArchiveShellCommand *this,SmallVectorImpl<char> *result)

{
  StringRef Str;
  raw_svector_ostream local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  raw_svector_ostream local_60;
  StringRef local_30;
  SmallVectorImpl<char> *local_20;
  SmallVectorImpl<char> *result_local;
  ArchiveShellCommand *this_local;
  
  local_20 = result;
  result_local = (SmallVectorImpl<char> *)this;
  local_30 = llbuild::buildsystem::ExternalCommand::getDescription(&this->super_ExternalCommand);
  this_local = (ArchiveShellCommand *)&local_30;
  if (local_30.Length == 0) {
    llvm::raw_svector_ostream::raw_svector_ostream(&local_60,local_20);
    std::operator+(&local_80,"Archiving ",&this->archiveName);
    llvm::raw_ostream::operator<<((raw_ostream *)&local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    llvm::raw_svector_ostream::~raw_svector_ostream(&local_60);
  }
  else {
    llvm::raw_svector_ostream::raw_svector_ostream(&local_b0,local_20);
    Str = llbuild::buildsystem::ExternalCommand::getDescription(&this->super_ExternalCommand);
    llvm::raw_ostream::operator<<((raw_ostream *)&local_b0,Str);
    llvm::raw_svector_ostream::~raw_svector_ostream(&local_b0);
  }
  return;
}

Assistant:

virtual void getShortDescription(SmallVectorImpl<char> &result) const override {
    if (getDescription().empty()) {
      llvm::raw_svector_ostream(result) << "Archiving " + archiveName;
    } else {
      llvm::raw_svector_ostream(result) << getDescription();
    }
  }